

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::copy(Fl_Input_ *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  char *pcVar2;
  int local_24;
  int local_20;
  int e;
  int b;
  int clipboard_local;
  Fl_Input_ *this_local;
  
  local_20 = position(this);
  local_24 = mark(this);
  if (local_20 == local_24) {
    this_local._4_4_ = 0;
  }
  else {
    if (local_24 < local_20) {
      local_20 = mark(this);
      local_24 = position(this);
    }
    iVar1 = input_type(this);
    if (iVar1 == 5) {
      local_24 = local_20;
    }
    pcVar2 = value(this);
    Fl::copy((EVP_PKEY_CTX *)(pcVar2 + local_20),(EVP_PKEY_CTX *)(ulong)(uint)(local_24 - local_20))
    ;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::copy(int clipboard) {
  int b = position();
  int e = mark();
  if (b != e) {
    if (b > e) {b = mark(); e = position();}
    if (input_type() == FL_SECRET_INPUT) e = b;
    Fl::copy(value()+b, e-b, clipboard);
    return 1;
  }
  return 0;
}